

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::JSONParser::ParseExpectedValues
          (JSONParser *this,
          vector<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_> *out_values)

{
  pointer pEVar1;
  bool bVar2;
  Result RVar3;
  Enum EVar4;
  bool bVar5;
  ExpectedValue value;
  
  pEVar1 = (out_values->
           super__Vector_base<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((out_values->
      super__Vector_base<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>)._M_impl
      .super__Vector_impl_data._M_finish != pEVar1) {
    (out_values->
    super__Vector_base<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>)._M_impl.
    super__Vector_impl_data._M_finish = pEVar1;
  }
  RVar3 = Expect(this,"[");
  if (RVar3.enum_ == Error) {
    EVar4 = Error;
  }
  else {
    bVar5 = true;
    while (bVar2 = Match(this,"]"), !bVar2) {
      if ((!bVar5) && (RVar3 = Expect(this,","), RVar3.enum_ == Error)) {
        return (Result)Error;
      }
      RVar3 = ParseExpectedValue(this,&value,Yes);
      if (RVar3.enum_ == Error) {
        return (Result)Error;
      }
      std::vector<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>::push_back
                (out_values,&value);
      bVar5 = false;
    }
    EVar4 = Ok;
  }
  return (Result)EVar4;
}

Assistant:

wabt::Result JSONParser::ParseExpectedValues(
    std::vector<ExpectedValue>* out_values) {
  out_values->clear();
  EXPECT("[");
  bool first = true;
  while (!Match("]")) {
    if (!first) {
      EXPECT(",");
    }
    ExpectedValue value;
    CHECK_RESULT(ParseExpectedValue(&value, AllowExpected::Yes));
    out_values->push_back(value);
    first = false;
  }
  return wabt::Result::Ok;
}